

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeMSA128Mem(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint32_t uVar1;
  int32_t iVar2;
  uint32_t RegNo;
  uint uVar3;
  uint Reg_00;
  uint Base;
  uint Reg;
  int Offset;
  MCRegisterInfo *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  uVar1 = fieldFromInstruction(Insn,0x10,10);
  iVar2 = SignExtend32(uVar1,10);
  uVar1 = fieldFromInstruction(Insn,6,5);
  RegNo = fieldFromInstruction(Insn,0xb,5);
  uVar3 = getReg(Decoder,0x2a,uVar1);
  Reg_00 = getReg(Decoder,8,RegNo);
  MCOperand_CreateReg0(Inst,uVar3);
  MCOperand_CreateReg0(Inst,Reg_00);
  uVar3 = MCInst_getOpcode(Inst);
  if (uVar3 == 0x395) {
LAB_001db73c:
    MCOperand_CreateImm0(Inst,(long)iVar2);
  }
  else {
    if (uVar3 == 0x396) {
LAB_001db772:
      MCOperand_CreateImm0(Inst,(long)(iVar2 << 3));
      return MCDisassembler_Success;
    }
    if (uVar3 == 0x397) {
LAB_001db74b:
      MCOperand_CreateImm0(Inst,(long)(iVar2 << 1));
      return MCDisassembler_Success;
    }
    if (uVar3 != 0x398) {
      if (uVar3 == 0x5f8) goto LAB_001db73c;
      if (uVar3 == 0x5f9) goto LAB_001db772;
      if (uVar3 == 0x5fa) goto LAB_001db74b;
      if (uVar3 != 0x5fb) {
        return MCDisassembler_Fail;
      }
    }
    MCOperand_CreateImm0(Inst,(long)(iVar2 << 2));
  }
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeMSA128Mem(MCInst *Inst, unsigned Insn,
		uint64_t Address, MCRegisterInfo *Decoder)
{
	int Offset = SignExtend32(fieldFromInstruction(Insn, 16, 10), 10);
	unsigned Reg = fieldFromInstruction(Insn, 6, 5);
	unsigned Base = fieldFromInstruction(Insn, 11, 5);

	Reg = getReg(Decoder, Mips_MSA128BRegClassID, Reg);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	MCOperand_CreateReg0(Inst, Reg);
	MCOperand_CreateReg0(Inst, Base);
	// MCOperand_CreateImm0(Inst, Offset);

	// The immediate field of an LD/ST instruction is scaled which means it must
	// be multiplied (when decoding) by the size (in bytes) of the instructions'
	// data format.
	// .b - 1 byte
	// .h - 2 bytes
	// .w - 4 bytes
	// .d - 8 bytes
	switch(MCInst_getOpcode(Inst)) {
		default:
			//assert (0 && "Unexpected instruction");
			return MCDisassembler_Fail;
			break;
		case Mips_LD_B:
		case Mips_ST_B:
			MCOperand_CreateImm0(Inst, Offset);
			break;
		case Mips_LD_H:
		case Mips_ST_H:
			MCOperand_CreateImm0(Inst, Offset * 2);
			break;
		case Mips_LD_W:
		case Mips_ST_W:
			MCOperand_CreateImm0(Inst, Offset * 4);
			break;
		case Mips_LD_D:
		case Mips_ST_D:
			MCOperand_CreateImm0(Inst, Offset * 8);
			break;
	}

	return MCDisassembler_Success;
}